

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O0

bool pbrt::ToGrid(Point3f p,Bounds3f *bounds,int *gridRes,Point3i *pi)

{
  float fVar1;
  Bounds3<float> *this;
  Point3f p_00;
  int iVar2;
  float *pfVar3;
  int *piVar4;
  undefined8 in_RDX;
  long in_RSI;
  undefined1 in_ZMM0 [64];
  undefined1 auVar6 [56];
  undefined1 auVar5 [64];
  Vector3f VVar7;
  int i;
  Vector3f pg;
  bool inBounds;
  bool local_7d;
  int local_7c;
  undefined8 local_48;
  float in_stack_ffffffffffffffc0;
  undefined3 in_stack_ffffffffffffffc4;
  int iVar8;
  byte bVar9;
  float fVar10;
  undefined4 uStack_34;
  
  this = (Bounds3<float> *)vmovlpd_avx(in_ZMM0._0_16_);
  fVar10 = (float)in_RDX;
  uStack_34 = (undefined4)((ulong)in_RDX >> 0x20);
  iVar8 = CONCAT13(1,in_stack_ffffffffffffffc4);
  auVar6 = ZEXT856(0);
  p_00.super_Tuple3<pbrt::Point3,_float>.y = (float)iVar8;
  p_00.super_Tuple3<pbrt::Point3,_float>.x = in_stack_ffffffffffffffc0;
  p_00.super_Tuple3<pbrt::Point3,_float>.z = fVar10;
  VVar7 = Bounds3<float>::Offset(this,p_00);
  auVar5._0_8_ = VVar7.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar5._8_56_ = auVar6;
  local_48 = vmovlpd_avx(auVar5._0_16_);
  for (local_7c = 0; bVar9 = (byte)((uint)iVar8 >> 0x18), local_7c < 3; local_7c = local_7c + 1) {
    iVar8 = *(int *)(in_RSI + (long)local_7c * 4);
    pfVar3 = Tuple3<pbrt::Vector3,_float>::operator[]
                       ((Tuple3<pbrt::Vector3,_float> *)&stack0xffffffffffffffb8,local_7c);
    fVar1 = *pfVar3;
    piVar4 = Tuple3<pbrt::Point3,_int>::operator[]
                       ((Tuple3<pbrt::Point3,_int> *)CONCAT44(uStack_34,fVar10),local_7c);
    *piVar4 = (int)((float)iVar8 * fVar1);
    piVar4 = Tuple3<pbrt::Point3,_int>::operator[]
                       ((Tuple3<pbrt::Point3,_int> *)CONCAT44(uStack_34,fVar10),local_7c);
    local_7d = false;
    if (-1 < *piVar4) {
      piVar4 = Tuple3<pbrt::Point3,_int>::operator[]
                         ((Tuple3<pbrt::Point3,_int> *)CONCAT44(uStack_34,fVar10),local_7c);
      local_7d = *piVar4 < *(int *)(in_RSI + (long)local_7c * 4);
    }
    iVar8 = (uint)((bVar9 & 1 & local_7d) != 0) << 0x18;
    piVar4 = Tuple3<pbrt::Point3,_int>::operator[]
                       ((Tuple3<pbrt::Point3,_int> *)CONCAT44(uStack_34,fVar10),local_7c);
    iVar2 = Clamp<int,int,int>(*piVar4,0,*(int *)(in_RSI + (long)local_7c * 4) + -1);
    piVar4 = Tuple3<pbrt::Point3,_int>::operator[]
                       ((Tuple3<pbrt::Point3,_int> *)CONCAT44(uStack_34,fVar10),local_7c);
    *piVar4 = iVar2;
  }
  return (bool)(bVar9 & 1);
}

Assistant:

static bool ToGrid(Point3f p, const Bounds3f &bounds, const int gridRes[3], Point3i *pi) {
    bool inBounds = true;
    Vector3f pg = bounds.Offset(p);
    for (int i = 0; i < 3; ++i) {
        (*pi)[i] = (int)(gridRes[i] * pg[i]);
        inBounds &= (*pi)[i] >= 0 && (*pi)[i] < gridRes[i];
        (*pi)[i] = Clamp((*pi)[i], 0, gridRes[i] - 1);
    }
    return inBounds;
}